

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O2

size_t __thiscall
spvtools::EnumSet<spvtools::Extension>::erase(EnumSet<spvtools::Extension> *this,Extension *value)

{
  Extension EVar1;
  pointer pBVar2;
  size_t sVar3;
  ulong uVar4;
  const_iterator __position;
  
  sVar3 = FindBucketForValue(this,*value);
  pBVar2 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar3 < (ulong)((long)(this->buckets_).
                            super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4)) {
    EVar1 = *value;
    if (pBVar2[sVar3].start == (EVar1 & ~kSPV_INTEL_masked_gather_scatter)) {
      __position._M_current = pBVar2 + sVar3;
      uVar4 = (__position._M_current)->data;
      if ((uVar4 >> ((ulong)EVar1 & 0x3f) & 1) != 0) {
        this->size_ = this->size_ - 1;
        uVar4 = uVar4 & ~(1L << ((byte)EVar1 & 0x3f));
        (__position._M_current)->data = uVar4;
        if (uVar4 != 0) {
          return 1;
        }
        std::
        vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ::erase(&this->buckets_,__position);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

size_t erase(const T& value) {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return 0;
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (!(bucket.data & mask)) {
      return 0;
    }

    size_ -= 1;
    bucket.data &= ~mask;
    if (bucket.data == 0) {
      buckets_.erase(buckets_.cbegin() + index);
    }
    return 1;
  }